

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeSet::~UnicodeSet(UnicodeSet *this)

{
  void *in_RSI;
  
  ~UnicodeSet((UnicodeSet *)&this[-1].fFlags);
  UMemory::operator_delete((UMemory *)&this[-1].fFlags,in_RSI);
  return;
}

Assistant:

UnicodeSet::~UnicodeSet() {
    _dbgdt(this); // first!
    uprv_free(list);
    delete bmpSet;
    if (buffer) {
        uprv_free(buffer);
    }
    delete strings;
    delete stringSpan;
    releasePattern();
}